

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O0

string * get_all_kv_cache_types_abi_cxx11_(void)

{
  bool bVar1;
  char *pcVar2;
  vector<ggml_type,_std::allocator<ggml_type>_> *pvVar3;
  string *in_RDI;
  ggml_type *type;
  const_iterator __end1;
  const_iterator __begin1;
  vector<ggml_type,_std::allocator<ggml_type>_> *__range1;
  ostringstream msg;
  vector<ggml_type,_std::allocator<ggml_type>_> *in_stack_fffffffffffffe28;
  ostream *in_stack_fffffffffffffe30;
  __normal_iterator<const_ggml_type_*,_std::vector<ggml_type,_std::allocator<ggml_type>_>_>
  local_190;
  vector<ggml_type,_std::allocator<ggml_type>_> *local_188;
  ostringstream local_180 [384];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  local_188 = &kv_cache_types;
  local_190._M_current =
       (ggml_type *)
       std::vector<ggml_type,_std::allocator<ggml_type>_>::begin(in_stack_fffffffffffffe28);
  std::vector<ggml_type,_std::allocator<ggml_type>_>::end(in_stack_fffffffffffffe28);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_ggml_type_*,_std::vector<ggml_type,_std::allocator<ggml_type>_>_>
                        *)in_stack_fffffffffffffe30,
                       (__normal_iterator<const_ggml_type_*,_std::vector<ggml_type,_std::allocator<ggml_type>_>_>
                        *)in_stack_fffffffffffffe28);
    if (!bVar1) break;
    in_stack_fffffffffffffe28 =
         (vector<ggml_type,_std::allocator<ggml_type>_> *)
         __gnu_cxx::
         __normal_iterator<const_ggml_type_*,_std::vector<ggml_type,_std::allocator<ggml_type>_>_>::
         operator*(&local_190);
    pcVar2 = (char *)ggml_type_name(*(undefined4 *)
                                     &(in_stack_fffffffffffffe28->
                                      super__Vector_base<ggml_type,_std::allocator<ggml_type>_>).
                                      _M_impl.super__Vector_impl_data._M_start);
    in_stack_fffffffffffffe30 = std::operator<<((ostream *)local_180,pcVar2);
    pvVar3 = (vector<ggml_type,_std::allocator<ggml_type>_> *)
             std::vector<ggml_type,_std::allocator<ggml_type>_>::back
                       ((vector<ggml_type,_std::allocator<ggml_type>_> *)in_stack_fffffffffffffe30);
    pcVar2 = ", ";
    if (in_stack_fffffffffffffe28 == pvVar3) {
      pcVar2 = "";
    }
    std::operator<<(in_stack_fffffffffffffe30,pcVar2);
    __gnu_cxx::
    __normal_iterator<const_ggml_type_*,_std::vector<ggml_type,_std::allocator<ggml_type>_>_>::
    operator++(&local_190);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return in_RDI;
}

Assistant:

static std::string get_all_kv_cache_types() {
    std::ostringstream msg;
    for (const auto & type : kv_cache_types) {
        msg << ggml_type_name(type) << (&type == &kv_cache_types.back() ? "" : ", ");
    }
    return msg.str();
}